

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int checkTreePage(IntegrityCk *pCheck,int iPage,i64 *piMinKey,i64 maxKey)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  BtShared *pBt;
  char *pcVar5;
  u8 *puVar6;
  bool bVar7;
  bool bVar8;
  MemPage *pMVar9;
  ushort uVar10;
  u16 uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  char *zFormat;
  uint *puVar21;
  ulong uVar22;
  uint *puVar23;
  int iVar24;
  ushort *puVar25;
  u8 uVar26;
  uint uVar28;
  MemPage *pPage;
  CellInfo info;
  int local_f8;
  i64 local_c8;
  ulong local_c0;
  MemPage *local_b8;
  MemPage *local_b0;
  ulong local_a8;
  undefined4 local_9c;
  uint local_98;
  uint local_94;
  int local_90;
  uint local_8c;
  int local_88;
  int local_84;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  BtShared *local_60;
  u8 *local_58;
  CellInfo local_50;
  i64 *local_38;
  undefined4 uVar27;
  
  local_b0 = (MemPage *)0x0;
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  pcVar5 = pCheck->zPfx;
  iVar24 = pCheck->v1;
  iVar4 = pCheck->v2;
  uVar13 = pBt->usableSize;
  local_c8 = maxKey;
  local_38 = piMinKey;
  iVar12 = checkRef(pCheck,iPage);
  if (iVar12 != 0) {
    return 0;
  }
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  local_a8 = (ulong)uVar13;
  local_88 = iVar4;
  local_84 = iVar24;
  uVar13 = btreeGetPage(pBt,iPage,&local_b0,0);
  pMVar9 = local_b0;
  if (uVar13 == 0) {
    uVar27 = CONCAT31((int3)((uint)iVar4 >> 8),local_b0->isInit);
    local_b0->isInit = '\0';
    uVar13 = btreeInitPage(local_b0);
    if (uVar13 == 0) {
      uVar13 = btreeComputeFreeSpace(pMVar9);
      if (uVar13 == 0) {
        puVar6 = pMVar9->aData;
        local_80 = (ulong)pMVar9->hdrOffset;
        pCheck->zPfx = "On tree page %d cell %d: ";
        bVar1 = puVar6[local_80 + 5];
        bVar2 = puVar6[local_80 + 6];
        local_70 = (ulong)puVar6[local_80 + 3] << 8;
        local_78 = (ulong)puVar6[local_80 + 4];
        local_68 = (ulong)((int)local_70 + (uint)puVar6[local_80 + 4]);
        local_b8 = pMVar9;
        lVar20 = local_80 - (uint)pMVar9->leaf * 4;
        local_60 = pBt;
        if (pMVar9->leaf == 0) {
          uVar13 = *(uint *)(puVar6 + local_80 + 8);
          uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 << 0x18;
          if (pBt->autoVacuum != '\0') {
            pCheck->zPfx = "On page %d at right child: ";
            checkPtrmap(pCheck,uVar13,'\x05',iPage);
          }
          local_f8 = checkTreePage(pCheck,uVar13,&local_c8,maxKey);
          puVar23 = (uint *)0x0;
          bVar7 = false;
        }
        else {
          puVar23 = pCheck->heap;
          *puVar23 = 0;
          local_f8 = -1;
          bVar7 = true;
        }
        local_58 = (u8 *)(lVar20 + 0xc);
        uVar13 = ((uint)bVar1 * 0x100 + (uint)bVar2) - 1 & 0xffff;
        if ((int)local_68 == 0) {
          bVar8 = false;
        }
        else {
          local_8c = uVar13 + 1;
          puVar25 = (ushort *)(puVar6 + ((int)lVar20 + 10 + (int)local_68 * 2));
          uVar28 = (int)local_70 + (int)local_78;
          uVar19 = (int)local_a8 - 4;
          local_90 = (int)local_a8 + -5;
          bVar8 = true;
          local_9c = uVar27;
          do {
            pMVar9 = local_b8;
            uVar28 = uVar28 - 1;
            if (pCheck->mxErr == 0) break;
            pCheck->v2 = uVar28;
            uVar10 = *puVar25 << 8 | *puVar25 >> 8;
            uVar17 = (uint)uVar10;
            if (uVar19 < uVar10 || uVar10 <= uVar13) {
              bVar8 = false;
              checkAppendMsg(pCheck,"Offset %d out of range %d..%d",(ulong)uVar17,(ulong)local_8c,
                             (ulong)uVar19);
            }
            else {
              puVar21 = (uint *)(puVar6 + uVar17);
              local_c0 = (ulong)uVar28;
              (*local_b8->xParseCell)(local_b8,(u8 *)puVar21,&local_50);
              if ((uint)local_a8 < local_50.nSize + uVar17) {
                bVar8 = false;
                checkAppendMsg(pCheck,"Extends off end of page");
              }
              else {
                if (pMVar9->intKey != '\0') {
                  if (bVar7) {
                    if (local_c8 < local_50.nKey) {
LAB_0015ca74:
                      checkAppendMsg(pCheck,"Rowid %lld out of order",local_50.nKey);
                    }
                  }
                  else if (local_c8 <= local_50.nKey) goto LAB_0015ca74;
                  local_c8 = local_50.nKey;
                  bVar7 = false;
                }
                if (local_50.nLocal < local_50.nPayload) {
                  uVar16 = ((local_50.nPayload + local_90) - (uint)local_50.nLocal) / uVar19;
                  uVar28 = *(uint *)((long)puVar21 + ((ulong)local_50.nSize - 4));
                  uVar28 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8 |
                           uVar28 << 0x18;
                  if (local_60->autoVacuum != '\0') {
                    local_98 = uVar28;
                    local_94 = uVar16;
                    checkPtrmap(pCheck,uVar28,'\x03',iPage);
                    uVar28 = local_98;
                    uVar16 = local_94;
                  }
                  checkList(pCheck,0,uVar28,uVar16);
                }
                if (local_b8->leaf == '\0') {
                  uVar28 = *puVar21;
                  uVar28 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8 |
                           uVar28 << 0x18;
                  if (local_60->autoVacuum != '\0') {
                    checkPtrmap(pCheck,uVar28,'\x05',iPage);
                  }
                  iVar24 = checkTreePage(pCheck,uVar28,&local_c8,local_c8);
                  if (iVar24 != local_f8) {
                    checkAppendMsg(pCheck,"Child page depth differs");
                    local_f8 = iVar24;
                  }
                  bVar7 = false;
                }
                else {
                  uVar16 = *puVar23 + 1;
                  *puVar23 = uVar16;
                  puVar23[uVar16] = ((uint)uVar10 + (uint)local_50.nSize) - 1 | uVar17 << 0x10;
                  if (1 < uVar16) {
                    uVar28 = (uint)local_c0;
                    uVar14 = (ulong)uVar16;
                    do {
                      uVar15 = uVar14 >> 1;
                      uVar17 = puVar23[uVar15];
                      if (uVar17 <= puVar23[uVar14]) break;
                      puVar23[uVar15] = puVar23[uVar14];
                      puVar23[uVar14] = uVar17;
                      uVar17 = (uint)uVar14;
                      uVar14 = uVar15;
                    } while (3 < uVar17);
                    goto LAB_0015cc1b;
                  }
                }
              }
              uVar28 = (uint)local_c0;
            }
LAB_0015cc1b:
            puVar25 = puVar25 + -1;
          } while (0 < (int)uVar28);
          bVar8 = !bVar8;
          uVar27 = local_9c;
        }
        uVar26 = (u8)uVar27;
        *local_38 = local_c8;
        pCheck->zPfx = (char *)0x0;
        bVar7 = true;
        if (bVar8) goto LAB_0015c7db;
        if (0 < pCheck->mxErr) {
          if (local_b8->leaf == '\0') {
            puVar23 = pCheck->heap;
            *puVar23 = 0;
            if ((int)local_68 != 0) {
              local_58 = local_58 + (long)puVar6;
              uVar14 = (ulong)((uint)local_70 | (uint)local_78);
              do {
                uVar10 = *(ushort *)(local_58 + uVar14 * 2 + -2) << 8 |
                         *(ushort *)(local_58 + uVar14 * 2 + -2) >> 8;
                uVar11 = (*local_b8->xCellSize)(local_b8,puVar6 + uVar10);
                uVar28 = *puVar23 + 1;
                *puVar23 = uVar28;
                puVar23[uVar28] = ((uint)uVar10 + (uint)uVar11) - 1 | (uint)uVar10 << 0x10;
                uVar15 = (ulong)uVar28;
                if (1 < uVar28) {
                  do {
                    uVar22 = uVar15 >> 1;
                    uVar28 = puVar23[uVar22];
                    if (uVar28 <= puVar23[uVar15]) break;
                    puVar23[uVar22] = puVar23[uVar15];
                    puVar23[uVar15] = uVar28;
                    uVar28 = (uint)uVar15;
                    uVar15 = uVar22;
                  } while (3 < uVar28);
                }
                bVar7 = 1 < (long)uVar14;
                uVar14 = uVar14 - 1;
              } while (bVar7);
            }
          }
          for (uVar10 = *(ushort *)(puVar6 + local_80 + 1) << 8 |
                        *(ushort *)(puVar6 + local_80 + 1) >> 8; uVar10 != 0;
              uVar10 = *(ushort *)(puVar6 + uVar10) << 8 | *(ushort *)(puVar6 + uVar10) >> 8) {
            uVar3 = *(ushort *)(puVar6 + (ulong)uVar10 + 2);
            uVar28 = *puVar23 + 1;
            *puVar23 = uVar28;
            puVar23[uVar28] =
                 ((uint)(ushort)(uVar3 << 8 | uVar3 >> 8) + (uint)uVar10) - 1 | (uint)uVar10 << 0x10
            ;
            uVar14 = (ulong)uVar28;
            if (1 < uVar28) {
              do {
                uVar15 = uVar14 >> 1;
                uVar28 = puVar23[uVar15];
                if (uVar28 <= puVar23[uVar14]) break;
                puVar23[uVar15] = puVar23[uVar14];
                puVar23[uVar14] = uVar28;
                uVar28 = (uint)uVar14;
                uVar14 = uVar15;
              } while (3 < uVar28);
            }
          }
          uVar28 = 0;
          iVar24 = 0;
          do {
            uVar19 = *puVar23;
            uVar14 = (ulong)uVar19;
            if (uVar14 != 0) {
              uVar28 = puVar23[1];
              puVar23[1] = puVar23[uVar14];
              puVar23[uVar14] = 0xffffffff;
              *puVar23 = uVar19 - 1;
              if (2 < uVar19) {
                uVar22 = 2;
                uVar15 = 1;
                do {
                  uVar18 = (ulong)((uint)uVar22 | 1);
                  if (puVar23[uVar22] <= puVar23[uVar18]) {
                    uVar18 = uVar22;
                  }
                  uVar19 = puVar23[uVar15];
                  if (uVar19 < puVar23[uVar18]) break;
                  puVar23[uVar15] = puVar23[uVar18];
                  puVar23[uVar18] = uVar19;
                  uVar19 = (int)uVar18 * 2;
                  uVar22 = (ulong)uVar19;
                  uVar15 = uVar18;
                } while (uVar19 <= *puVar23);
              }
            }
            if (uVar14 == 0) goto LAB_0015ce6f;
            uVar19 = uVar28 >> 0x10;
            if (uVar19 <= (uVar13 & 0xffff)) goto LAB_0015ce54;
            iVar24 = iVar24 + uVar19 + ~(uVar13 & 0xffff);
            uVar13 = uVar28;
          } while( true );
        }
        goto LAB_0015c7d6;
      }
      zFormat = "free space corruption";
    }
    else {
      zFormat = "btreeInitPage() returns error code %d";
    }
    checkAppendMsg(pCheck,zFormat,(ulong)uVar13);
    local_f8 = -1;
  }
  else {
    checkAppendMsg(pCheck,"unable to get the page. error code=%d",(ulong)uVar13);
    local_f8 = -1;
    uVar27 = 0;
  }
LAB_0015c7d6:
  uVar26 = (u8)uVar27;
  bVar7 = false;
LAB_0015c7db:
  iVar4 = local_84;
  iVar24 = local_88;
  if (bVar7) {
    local_b0->isInit = uVar26;
  }
  if (local_b0 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_b0->pDbPage);
  }
  pCheck->zPfx = pcVar5;
  pCheck->v1 = iVar4;
  pCheck->v2 = iVar24;
  return local_f8 + 1;
LAB_0015ce54:
  checkAppendMsg(pCheck,"Multiple uses for byte %u of page %d",(ulong)uVar19,(ulong)(uint)iPage);
LAB_0015ce6f:
  if (*puVar23 == 0) {
    uVar13 = (int)local_a8 + (~uVar13 | 0xffff0000) + iVar24;
    if (uVar13 == puVar6[local_80 + 7]) {
      bVar7 = false;
    }
    else {
      bVar7 = false;
      checkAppendMsg(pCheck,"Fragmentation of %d bytes reported as %d on page %d",(ulong)uVar13,
                     (ulong)puVar6[local_80 + 7],(ulong)(uint)iPage);
    }
  }
  else {
    bVar7 = false;
  }
  goto LAB_0015c7db;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  if( (rc = btreeComputeFreeSpace(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );
    checkAppendMsg(pCheck, "free space corruption", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "On tree page %d cell %d: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "On page %d at right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %d out of range %d..%d",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      u32 nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page. 
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize ); /* due to btreeComputeFreeSpace() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );     /* Enforced by btreeComputeFreeSpace() */
      assert( (u32)j<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or 
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    ** 
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.  
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %d", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %d",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}